

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O2

int nghttp2_http_on_data_chunk(nghttp2_stream *stream,size_t n)

{
  long lVar1;
  
  lVar1 = n + stream->recv_content_length;
  stream->recv_content_length = lVar1;
  if ((stream->http_flags & 0x4000) == 0) {
    return -(uint)(stream->content_length < lVar1 && stream->content_length != -1);
  }
  return -1;
}

Assistant:

int nghttp2_http_on_data_chunk(nghttp2_stream *stream, size_t n) {
  stream->recv_content_length += (int64_t)n;

  if ((stream->http_flags & NGHTTP2_HTTP_FLAG_EXPECT_FINAL_RESPONSE) ||
      (stream->content_length != -1 &&
       stream->recv_content_length > stream->content_length)) {
    return -1;
  }

  return 0;
}